

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listenable_impl.hpp
# Opt level: O2

void __thiscall
wigwag::detail::
listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
::handler_node::handler_node
          (handler_node *this,
          intrusive_ptr<wigwag::detail::listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
          *impl,handler_type *handler)

{
  intrusive_list_node *piVar1;
  listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
  *plVar2;
  
  (this->super_life_assurance)._lock_counter_and_alive_flag =
       (__atomic_base<unsigned_int>)0x80000000;
  (this->super_life_assurance)._ref_count = (__atomic_base<int>)0x2;
  piVar1 = &this->super_intrusive_list_node;
  (this->super_intrusive_list_node)._prev = piVar1;
  (this->super_intrusive_list_node)._next = piVar1;
  (this->super_implementation)._vptr_implementation = (_func_int **)&PTR_release_token_impl_00269250
  ;
  (this->super_life_assurance)._vptr_life_assurance = (_func_int **)&PTR__handler_node_00269280;
  (this->_listenable_impl)._raw = impl->_raw;
  impl->_raw = (listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
                *)0x0;
  std::function<void_()>::function(&(this->_handler).obj,handler);
  plVar2 = (this->_listenable_impl)._raw;
  (this->super_intrusive_list_node)._prev = (plVar2->_handlers)._root._prev;
  (this->super_intrusive_list_node)._next = &(plVar2->_handlers)._root;
  (plVar2->_handlers)._root._prev = piVar1;
  ((this->super_intrusive_list_node)._prev)->_next = piVar1;
  return;
}

Assistant:

handler_node(intrusive_ptr<listenable_impl> impl, handler_type handler)
                : _listenable_impl(std::move(impl)), _handler(std::move(handler))
            { _listenable_impl->get_handlers_container().push_back(*this); }